

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall Inject::default_impl::test_method(default_impl *this)

{
  int iVar1;
  service *psVar2;
  undefined4 extraout_var;
  service *psVar3;
  component<Inject::impl1> y;
  implemented_by<Inject::impl1,_(inject::component_scope)0> xx;
  component<Inject::service> x;
  injected<Inject::service> second;
  injected<Inject::service> first;
  undefined8 local_140;
  undefined8 local_138;
  shared_count sStack_130;
  char *local_128;
  char *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  char **local_100;
  provides<Inject::service> yy;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  context<0> c;
  
  inject::context<0>::component<Inject::service>::component(&x);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::implemented_by(&xx);
  inject::context<0>::component<Inject::impl1>::component(&y);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&yy);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_0015fda8;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::injected<Inject::service>::injected(&first);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x129);
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0015fea8;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = (char **)0x14c75c;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_120 = "";
  psVar2 = inject::context<0>::injected<Inject::service>::operator->(&first);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_140 = CONCAT44(extraout_var,iVar1);
  second._ptr.px = (element_type *)inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_118,&local_128,0x129,1,2,&local_140,"first->id()",&second,"id_of<impl1>::id()");
  inject::context<0>::injected<Inject::service>::injected(&second);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x12d);
  psVar2 = inject::context<0>::injected<Inject::service>::get(&first);
  psVar3 = inject::context<0>::injected<Inject::service>::get(&second);
  local_140 = CONCAT71(local_140._1_7_,psVar2 != psVar3);
  local_138 = 0;
  sStack_130.pi_ = (sp_counted_base *)0x0;
  local_100 = &local_e0;
  local_e0 = "first.get() != second.get()";
  local_d8 = "";
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0015ff38;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_130);
  boost::detail::shared_count::~shared_count(&second._ptr.pn);
  boost::detail::shared_count::~shared_count(&first._ptr.pn);
  inject::context<0>::~context(&c);
  inject::context<0>::component<Inject::impl1>::~component(&y);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::~implemented_by(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(default_impl)
{
    context<>::component<service> x;
    context<>::component<service>::implemented_by<impl1> xx;

    context<>::component<impl1> y;
    context<>::component<impl1>::provides<service> yy;

    context<> c;

    context<>::injected<service> first;
    BOOST_CHECK_EQUAL(first->id(), id_of<impl1>::id());

    // check that default scope is scope_none (not singleton)
    context<>::injected<service> second;
    BOOST_CHECK(first.get() != second.get());
}